

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.cpp
# Opt level: O2

UniValue * MempoolInfoToJSON(UniValue *__return_storage_ptr__,CTxMemPool *pool)

{
  string str;
  string key;
  string key_00;
  string key_01;
  string key_02;
  string key_03;
  string key_04;
  string key_05;
  string key_06;
  string key_07;
  string key_08;
  string key_09;
  CFeeRate CVar1;
  CFeeRate amount;
  long in_FS_OFFSET;
  allocator<char> local_5b8;
  undefined7 uStack_5b7;
  undefined1 auStack_5b0 [8];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock14;
  UniValue in_stack_fffffffffffffa68;
  string local_540 [32];
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  local_520;
  UniValue local_4f0;
  string local_498 [32];
  UniValue local_478;
  string local_420 [32];
  UniValue local_400;
  string local_3a8 [32];
  UniValue local_388;
  string local_330 [32];
  UniValue local_310;
  string local_2b8 [32];
  UniValue local_298;
  string local_240 [32];
  UniValue local_220;
  string local_1c8 [32];
  UniValue local_1a8;
  string local_150 [32];
  UniValue local_130;
  string local_d8 [32];
  UniValue local_b8;
  string local_60 [32];
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30 [16];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock14,&pool->cs,"pool.cs",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/mempool.cpp"
             ,0x29e,false);
  local_40 = local_30;
  local_38 = 0;
  local_30[0] = 0;
  str._M_dataplus._M_p._1_7_ = uStack_5b7;
  str._M_dataplus._M_p._0_1_ = local_5b8;
  str._M_string_length = (size_type)auStack_5b0;
  str.field_2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 )criticalblock14.super_unique_lock;
  UniValue::UniValue(__return_storage_ptr__,VOBJ,str);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            (local_60,"loaded",(allocator<char> *)&local_520);
  local_5b8 = (allocator<char>)CTxMemPool::GetLoadTried(pool);
  UniValue::UniValue<bool,_bool,_true>(&local_b8,(bool *)&local_5b8);
  key._M_dataplus._M_p._1_7_ = uStack_5b7;
  key._M_dataplus._M_p._0_1_ = local_5b8;
  key._M_string_length = (size_type)auStack_5b0;
  key.field_2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 )criticalblock14.super_unique_lock;
  UniValue::pushKV(__return_storage_ptr__,key,in_stack_fffffffffffffa68);
  UniValue::~UniValue(&local_b8);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"size",&local_5b8);
  local_520._M_impl._0_8_ = CTxMemPool::size(pool);
  UniValue::UniValue<long,_long,_true>(&local_130,(long *)&local_520);
  key_00._M_dataplus._M_p._1_7_ = uStack_5b7;
  key_00._M_dataplus._M_p._0_1_ = local_5b8;
  key_00._M_string_length = (size_type)auStack_5b0;
  key_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )criticalblock14.super_unique_lock;
  UniValue::pushKV(__return_storage_ptr__,key_00,in_stack_fffffffffffffa68);
  UniValue::~UniValue(&local_130);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::string<std::allocator<char>>(local_150,"bytes",&local_5b8);
  local_520._M_impl._0_8_ = pool->totalTxSize;
  UniValue::UniValue<long,_long,_true>(&local_1a8,(long *)&local_520);
  key_01._M_dataplus._M_p._1_7_ = uStack_5b7;
  key_01._M_dataplus._M_p._0_1_ = local_5b8;
  key_01._M_string_length = (size_type)auStack_5b0;
  key_01.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )criticalblock14.super_unique_lock;
  UniValue::pushKV(__return_storage_ptr__,key_01,in_stack_fffffffffffffa68);
  UniValue::~UniValue(&local_1a8);
  std::__cxx11::string::~string(local_150);
  std::__cxx11::string::string<std::allocator<char>>(local_1c8,"usage",&local_5b8);
  local_520._M_impl._0_8_ = CTxMemPool::DynamicMemoryUsage(pool);
  UniValue::UniValue<long,_long,_true>(&local_220,(long *)&local_520);
  key_02._M_dataplus._M_p._1_7_ = uStack_5b7;
  key_02._M_dataplus._M_p._0_1_ = local_5b8;
  key_02._M_string_length = (size_type)auStack_5b0;
  key_02.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )criticalblock14.super_unique_lock;
  UniValue::pushKV(__return_storage_ptr__,key_02,in_stack_fffffffffffffa68);
  UniValue::~UniValue(&local_220);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_240,"total_fee",(allocator<char> *)&local_520);
  ValueFromAmount(&local_298,pool->m_total_fee);
  key_03._M_dataplus._M_p._1_7_ = uStack_5b7;
  key_03._M_dataplus._M_p._0_1_ = local_5b8;
  key_03._M_string_length = (size_type)auStack_5b0;
  key_03.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )criticalblock14.super_unique_lock;
  UniValue::pushKV(__return_storage_ptr__,key_03,in_stack_fffffffffffffa68);
  UniValue::~UniValue(&local_298);
  std::__cxx11::string::~string(local_240);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2b8,"maxmempool",(allocator<char> *)&local_520);
  UniValue::UniValue<const_long_&,_long,_true>(&local_310,&(pool->m_opts).max_size_bytes);
  key_04._M_dataplus._M_p._1_7_ = uStack_5b7;
  key_04._M_dataplus._M_p._0_1_ = local_5b8;
  key_04._M_string_length = (size_type)auStack_5b0;
  key_04.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )criticalblock14.super_unique_lock;
  UniValue::pushKV(__return_storage_ptr__,key_04,in_stack_fffffffffffffa68);
  UniValue::~UniValue(&local_310);
  std::__cxx11::string::~string(local_2b8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_330,"mempoolminfee",(allocator<char> *)&local_520);
  CVar1 = CTxMemPool::GetMinFee(pool);
  amount.nSatoshisPerK = (pool->m_opts).min_relay_feerate.nSatoshisPerK;
  if (amount.nSatoshisPerK < CVar1.nSatoshisPerK) {
    amount = CVar1;
  }
  ValueFromAmount(&local_388,amount.nSatoshisPerK);
  key_05._M_dataplus._M_p._1_7_ = uStack_5b7;
  key_05._M_dataplus._M_p._0_1_ = local_5b8;
  key_05._M_string_length = (size_type)auStack_5b0;
  key_05.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )criticalblock14.super_unique_lock;
  UniValue::pushKV(__return_storage_ptr__,key_05,in_stack_fffffffffffffa68);
  UniValue::~UniValue(&local_388);
  std::__cxx11::string::~string(local_330);
  std::__cxx11::string::string<std::allocator<char>>
            (local_3a8,"minrelaytxfee",(allocator<char> *)&local_520);
  ValueFromAmount(&local_400,(pool->m_opts).min_relay_feerate.nSatoshisPerK);
  key_06._M_dataplus._M_p._1_7_ = uStack_5b7;
  key_06._M_dataplus._M_p._0_1_ = local_5b8;
  key_06._M_string_length = (size_type)auStack_5b0;
  key_06.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )criticalblock14.super_unique_lock;
  UniValue::pushKV(__return_storage_ptr__,key_06,in_stack_fffffffffffffa68);
  UniValue::~UniValue(&local_400);
  std::__cxx11::string::~string(local_3a8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_420,"incrementalrelayfee",(allocator<char> *)&local_520);
  ValueFromAmount(&local_478,(pool->m_opts).incremental_relay_feerate.nSatoshisPerK);
  key_07._M_dataplus._M_p._1_7_ = uStack_5b7;
  key_07._M_dataplus._M_p._0_1_ = local_5b8;
  key_07._M_string_length = (size_type)auStack_5b0;
  key_07.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )criticalblock14.super_unique_lock;
  UniValue::pushKV(__return_storage_ptr__,key_07,in_stack_fffffffffffffa68);
  UniValue::~UniValue(&local_478);
  std::__cxx11::string::~string(local_420);
  std::__cxx11::string::string<std::allocator<char>>
            (local_498,"unbroadcastcount",(allocator<char> *)(auStack_5b0 + 7));
  CTxMemPool::GetUnbroadcastTxs
            ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)&local_520,pool);
  local_5b8 = SUB81(local_520._M_impl.super__Rb_tree_header._M_node_count,0);
  uStack_5b7 = (undefined7)(local_520._M_impl.super__Rb_tree_header._M_node_count >> 8);
  UniValue::UniValue<unsigned_long,_unsigned_long,_true>(&local_4f0,(unsigned_long *)&local_5b8);
  key_08._M_dataplus._M_p._1_7_ = uStack_5b7;
  key_08._M_dataplus._M_p._0_1_ = local_5b8;
  key_08._M_string_length = (size_type)auStack_5b0;
  key_08.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )criticalblock14.super_unique_lock;
  UniValue::pushKV(__return_storage_ptr__,key_08,in_stack_fffffffffffffa68);
  UniValue::~UniValue(&local_4f0);
  std::
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  ::~_Rb_tree(&local_520);
  std::__cxx11::string::~string(local_498);
  std::__cxx11::string::string<std::allocator<char>>
            (local_540,"fullrbf",(allocator<char> *)&local_520);
  UniValue::UniValue<const_bool_&,_bool,_true>
            ((UniValue *)&stack0xfffffffffffffa68,&(pool->m_opts).full_rbf);
  key_09._M_dataplus._M_p._1_7_ = uStack_5b7;
  key_09._M_dataplus._M_p._0_1_ = local_5b8;
  key_09._M_string_length = (size_type)auStack_5b0;
  key_09.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )criticalblock14.super_unique_lock;
  UniValue::pushKV(__return_storage_ptr__,key_09,in_stack_fffffffffffffa68);
  UniValue::~UniValue((UniValue *)&stack0xfffffffffffffa68);
  std::__cxx11::string::~string(local_540);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock14.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue MempoolInfoToJSON(const CTxMemPool& pool)
{
    // Make sure this call is atomic in the pool.
    LOCK(pool.cs);
    UniValue ret(UniValue::VOBJ);
    ret.pushKV("loaded", pool.GetLoadTried());
    ret.pushKV("size", (int64_t)pool.size());
    ret.pushKV("bytes", (int64_t)pool.GetTotalTxSize());
    ret.pushKV("usage", (int64_t)pool.DynamicMemoryUsage());
    ret.pushKV("total_fee", ValueFromAmount(pool.GetTotalFee()));
    ret.pushKV("maxmempool", pool.m_opts.max_size_bytes);
    ret.pushKV("mempoolminfee", ValueFromAmount(std::max(pool.GetMinFee(), pool.m_opts.min_relay_feerate).GetFeePerK()));
    ret.pushKV("minrelaytxfee", ValueFromAmount(pool.m_opts.min_relay_feerate.GetFeePerK()));
    ret.pushKV("incrementalrelayfee", ValueFromAmount(pool.m_opts.incremental_relay_feerate.GetFeePerK()));
    ret.pushKV("unbroadcastcount", uint64_t{pool.GetUnbroadcastTxs().size()});
    ret.pushKV("fullrbf", pool.m_opts.full_rbf);
    return ret;
}